

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_gcc.cc
# Opt level: O2

void I422ToARGBRow_SSSE3(uint8_t *y_buf,uint8_t *u_buf,uint8_t *v_buf,uint8_t *dst_argb,
                        YuvConstants *yuvconstants,int width)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined4 uVar6;
  undefined4 uVar7;
  bool bVar8;
  char cVar9;
  char cVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  short sVar19;
  short sVar20;
  short sVar21;
  short sVar22;
  short sVar23;
  short sVar24;
  short sVar25;
  short sVar26;
  short sVar27;
  short sVar28;
  short sVar29;
  short sVar30;
  short sVar31;
  short sVar32;
  short sVar33;
  undefined8 uVar34;
  short sVar35;
  short sVar36;
  short sVar37;
  short sVar38;
  short sVar39;
  short sVar40;
  short sVar41;
  short sVar42;
  short sVar43;
  short sVar44;
  short sVar45;
  short sVar46;
  short sVar47;
  short sVar48;
  short sVar49;
  short sVar50;
  short sVar51;
  short sVar52;
  short sVar53;
  short sVar54;
  short sVar55;
  short sVar56;
  short sVar57;
  short sVar58;
  undefined6 uVar59;
  ushort uVar60;
  undefined1 auVar61 [14];
  undefined1 auVar62 [12];
  unkbyte10 Var63;
  undefined1 auVar64 [14];
  undefined1 auVar65 [12];
  unkbyte10 Var66;
  undefined3 uVar67;
  unkbyte9 Var68;
  unkbyte9 Var69;
  uint uVar70;
  undefined1 auVar71 [11];
  undefined5 uVar72;
  unkbyte9 Var73;
  uint6 uVar74;
  undefined1 auVar75 [13];
  unkbyte9 Var76;
  undefined1 auVar77 [15];
  long lVar78;
  int iVar79;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar107 [16];
  int width_local;
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined2 uVar87;
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 uVar108;
  
  auVar2 = *(undefined1 (*) [16])yuvconstants->kUVToB;
  auVar3 = *(undefined1 (*) [16])yuvconstants->kUVToG;
  auVar4 = *(undefined1 (*) [16])yuvconstants->kUVToR;
  sVar35 = yuvconstants->kUVBiasB[0];
  sVar36 = yuvconstants->kUVBiasB[1];
  sVar37 = yuvconstants->kUVBiasB[2];
  sVar38 = yuvconstants->kUVBiasB[3];
  sVar39 = yuvconstants->kUVBiasB[4];
  sVar40 = yuvconstants->kUVBiasB[5];
  sVar41 = yuvconstants->kUVBiasB[6];
  sVar42 = yuvconstants->kUVBiasB[7];
  sVar43 = yuvconstants->kUVBiasG[0];
  sVar44 = yuvconstants->kUVBiasG[1];
  sVar45 = yuvconstants->kUVBiasG[2];
  sVar46 = yuvconstants->kUVBiasG[3];
  sVar47 = yuvconstants->kUVBiasG[4];
  sVar48 = yuvconstants->kUVBiasG[5];
  sVar49 = yuvconstants->kUVBiasG[6];
  sVar50 = yuvconstants->kUVBiasG[7];
  sVar51 = yuvconstants->kUVBiasR[0];
  sVar52 = yuvconstants->kUVBiasR[1];
  sVar53 = yuvconstants->kUVBiasR[2];
  sVar54 = yuvconstants->kUVBiasR[3];
  sVar55 = yuvconstants->kUVBiasR[4];
  sVar56 = yuvconstants->kUVBiasR[5];
  sVar57 = yuvconstants->kUVBiasR[6];
  sVar58 = yuvconstants->kUVBiasR[7];
  auVar5 = *(undefined1 (*) [16])yuvconstants->kYToRgb;
  lVar78 = (long)v_buf - (long)u_buf;
  do {
    uVar6 = *(undefined4 *)u_buf;
    uVar7 = *(undefined4 *)(u_buf + lVar78);
    u_buf = u_buf + 4;
    uVar87 = CONCAT11((char)((uint)uVar7 >> 0x18),(char)((uint)uVar6 >> 0x18));
    uVar34 = CONCAT35(CONCAT21(uVar87,(char)((uint)uVar7 >> 0x10)),
                      CONCAT14((char)((uint)uVar6 >> 0x10),uVar6));
    uVar59 = CONCAT51(CONCAT41((int)((ulong)uVar34 >> 0x20),(char)((uint)uVar7 >> 8)),
                      (char)((uint)uVar6 >> 8));
    auVar98._0_2_ = CONCAT11((char)uVar7,(char)uVar6);
    uVar1 = CONCAT62(uVar59,auVar98._0_2_);
    auVar80._8_4_ = 0;
    auVar80._0_8_ = uVar1;
    auVar80._12_2_ = uVar87;
    auVar80._14_2_ = uVar87;
    uVar87 = (undefined2)((ulong)uVar34 >> 0x20);
    auVar107._12_4_ = auVar80._12_4_;
    auVar107._8_2_ = 0;
    auVar107._0_8_ = uVar1;
    auVar107._10_2_ = uVar87;
    auVar88._10_6_ = auVar107._10_6_;
    auVar88._8_2_ = uVar87;
    auVar88._0_8_ = uVar1;
    uVar87 = (undefined2)uVar59;
    auVar98._8_8_ = auVar88._8_8_;
    auVar98._6_2_ = uVar87;
    auVar98._4_2_ = uVar87;
    auVar98._2_2_ = auVar98._0_2_;
    uVar1 = *(ulong *)y_buf;
    uVar108 = (undefined1)(uVar1 >> 0x38);
    auVar106._8_6_ = 0;
    auVar106._0_8_ = uVar1;
    auVar106[0xe] = uVar108;
    auVar106[0xf] = uVar108;
    uVar108 = (undefined1)(uVar1 >> 0x30);
    auVar105._14_2_ = auVar106._14_2_;
    auVar105._8_5_ = 0;
    auVar105._0_8_ = uVar1;
    auVar105[0xd] = uVar108;
    auVar104._13_3_ = auVar105._13_3_;
    auVar104._8_4_ = 0;
    auVar104._0_8_ = uVar1;
    auVar104[0xc] = uVar108;
    uVar108 = (undefined1)(uVar1 >> 0x28);
    auVar103._12_4_ = auVar104._12_4_;
    auVar103._8_3_ = 0;
    auVar103._0_8_ = uVar1;
    auVar103[0xb] = uVar108;
    auVar102._11_5_ = auVar103._11_5_;
    auVar102._8_2_ = 0;
    auVar102._0_8_ = uVar1;
    auVar102[10] = uVar108;
    uVar108 = (undefined1)(uVar1 >> 0x20);
    auVar101._10_6_ = auVar102._10_6_;
    auVar101[8] = 0;
    auVar101._0_8_ = uVar1;
    auVar101[9] = uVar108;
    auVar100._9_7_ = auVar101._9_7_;
    auVar100[8] = uVar108;
    auVar100._0_8_ = uVar1;
    uVar108 = (undefined1)(uVar1 >> 0x18);
    auVar99._8_8_ = auVar100._8_8_;
    auVar99[7] = uVar108;
    auVar99[6] = uVar108;
    uVar108 = (undefined1)(uVar1 >> 0x10);
    auVar99[5] = uVar108;
    auVar99[4] = uVar108;
    uVar108 = (undefined1)(uVar1 >> 8);
    auVar99[3] = uVar108;
    auVar99[2] = uVar108;
    auVar99[0] = (undefined1)uVar1;
    auVar99[1] = auVar99[0];
    y_buf = (uint8_t *)((long)y_buf + 8);
    auVar88 = pmaddubsw(auVar98,auVar2);
    auVar81._0_2_ = sVar35 - auVar88._0_2_;
    auVar81._2_2_ = sVar36 - auVar88._2_2_;
    auVar81._4_2_ = sVar37 - auVar88._4_2_;
    auVar81._6_2_ = sVar38 - auVar88._6_2_;
    auVar81._8_2_ = sVar39 - auVar88._8_2_;
    auVar81._10_2_ = sVar40 - auVar88._10_2_;
    auVar81._12_2_ = sVar41 - auVar88._12_2_;
    auVar81._14_2_ = sVar42 - auVar88._14_2_;
    auVar88 = pmaddubsw(auVar98,auVar3);
    auVar89._0_2_ = sVar43 - auVar88._0_2_;
    auVar89._2_2_ = sVar44 - auVar88._2_2_;
    auVar89._4_2_ = sVar45 - auVar88._4_2_;
    auVar89._6_2_ = sVar46 - auVar88._6_2_;
    auVar89._8_2_ = sVar47 - auVar88._8_2_;
    auVar89._10_2_ = sVar48 - auVar88._10_2_;
    auVar89._12_2_ = sVar49 - auVar88._12_2_;
    auVar89._14_2_ = sVar50 - auVar88._14_2_;
    auVar98 = pmaddubsw(auVar98,auVar4);
    auVar90._0_2_ = sVar51 - auVar98._0_2_;
    auVar90._2_2_ = sVar52 - auVar98._2_2_;
    auVar90._4_2_ = sVar53 - auVar98._4_2_;
    auVar90._6_2_ = sVar54 - auVar98._6_2_;
    auVar90._8_2_ = sVar55 - auVar98._8_2_;
    auVar90._10_2_ = sVar56 - auVar98._10_2_;
    auVar90._12_2_ = sVar57 - auVar98._12_2_;
    auVar90._14_2_ = sVar58 - auVar98._14_2_;
    auVar107 = pmulhuw(auVar99,auVar5);
    auVar98 = paddsw(auVar81,auVar107);
    auVar88 = paddsw(auVar89,auVar107);
    auVar107 = paddsw(auVar90,auVar107);
    auVar98 = psraw(auVar98,6);
    auVar88 = psraw(auVar88,6);
    auVar107 = psraw(auVar107,6);
    sVar11 = auVar98._0_2_;
    sVar13 = auVar98._2_2_;
    sVar16 = auVar98._4_2_;
    sVar19 = auVar98._6_2_;
    sVar22 = auVar98._8_2_;
    sVar25 = auVar98._10_2_;
    sVar28 = auVar98._12_2_;
    sVar31 = auVar98._14_2_;
    cVar9 = (0 < sVar31) * (sVar31 < 0x100) * auVar98[0xe] - (0xff < sVar31);
    sVar31 = auVar88._0_2_;
    sVar14 = auVar88._2_2_;
    sVar17 = auVar88._4_2_;
    sVar20 = auVar88._6_2_;
    sVar23 = auVar88._8_2_;
    sVar26 = auVar88._10_2_;
    sVar29 = auVar88._12_2_;
    sVar32 = auVar88._14_2_;
    sVar12 = auVar107._0_2_;
    sVar15 = auVar107._2_2_;
    sVar18 = auVar107._4_2_;
    sVar21 = auVar107._6_2_;
    sVar24 = auVar107._8_2_;
    sVar27 = auVar107._10_2_;
    sVar30 = auVar107._12_2_;
    sVar33 = auVar107._14_2_;
    cVar10 = (0 < sVar33) * (sVar33 < 0x100) * auVar107[0xe] - (0xff < sVar33);
    uVar60 = CONCAT11((0 < sVar12) * (sVar12 < 0x100) * auVar107[0] - (0xff < sVar12),cVar10);
    auVar94._0_9_ = (unkuint9)uVar60 << 0x38;
    uVar67 = CONCAT12((0 < sVar15) * (sVar15 < 0x100) * auVar107[2] - (0xff < sVar15),uVar60);
    uVar70 = CONCAT13((0 < sVar18) * (sVar18 < 0x100) * auVar107[4] - (0xff < sVar18),uVar67);
    auVar71._4_7_ = 0;
    auVar71._0_4_ = uVar70;
    auVar95._0_11_ = auVar71 << 0x38;
    uVar72 = CONCAT14((0 < sVar21) * (sVar21 < 0x100) * auVar107[6] - (0xff < sVar21),uVar70);
    uVar74 = CONCAT15((0 < sVar24) * (sVar24 < 0x100) * auVar107[8] - (0xff < sVar24),uVar72);
    auVar75._6_7_ = 0;
    auVar75._0_6_ = uVar74;
    auVar96._0_13_ = auVar75 << 0x38;
    auVar77[6] = (0 < sVar27) * (sVar27 < 0x100) * auVar107[10] - (0xff < sVar27);
    auVar77._0_6_ = uVar74;
    uVar87 = CONCAT11((0 < sVar32) * (sVar32 < 0x100) * auVar88[0xe] - (0xff < sVar32),cVar9);
    uVar6 = CONCAT31(CONCAT21(uVar87,(0 < sVar29) * (sVar29 < 0x100) * auVar88[0xc] -
                                     (0xff < sVar29)),
                     (0 < sVar28) * (sVar28 < 0x100) * auVar98[0xc] - (0xff < sVar28));
    uVar59 = CONCAT51(CONCAT41(uVar6,(0 < sVar26) * (sVar26 < 0x100) * auVar88[10] - (0xff < sVar26)
                              ),(0 < sVar25) * (sVar25 < 0x100) * auVar98[10] - (0xff < sVar25));
    Var68 = CONCAT72(CONCAT61(uVar59,(0 < sVar23) * (sVar23 < 0x100) * auVar88[8] - (0xff < sVar23))
                     ,CONCAT11((0 < sVar22) * (sVar22 < 0x100) * auVar98[8] - (0xff < sVar22),cVar9)
                    );
    Var63 = CONCAT91(CONCAT81((long)((unkuint9)Var68 >> 8),
                              (0 < sVar20) * (sVar20 < 0x100) * auVar88[6] - (0xff < sVar20)),
                     (0 < sVar19) * (sVar19 < 0x100) * auVar98[6] - (0xff < sVar19));
    auVar62._2_10_ = Var63;
    auVar62[1] = (0 < sVar17) * (sVar17 < 0x100) * auVar88[4] - (0xff < sVar17);
    auVar62[0] = (0 < sVar16) * (sVar16 < 0x100) * auVar98[4] - (0xff < sVar16);
    auVar61._2_12_ = auVar62;
    auVar61[1] = (0 < sVar14) * (sVar14 < 0x100) * auVar88[2] - (0xff < sVar14);
    auVar61[0] = (0 < sVar13) * (sVar13 < 0x100) * auVar98[2] - (0xff < sVar13);
    auVar82._0_2_ =
         CONCAT11((0 < sVar31) * (sVar31 < 0x100) * auVar88[0] - (0xff < sVar31),
                  (0 < sVar11) * (sVar11 < 0x100) * auVar98[0] - (0xff < sVar11));
    auVar82._2_14_ = auVar61;
    auVar77[7] = cVar10;
    auVar77._8_7_ = 0;
    auVar97._0_15_ = auVar77 << 0x38;
    auVar97[0xf] = 0xff;
    auVar96._14_2_ = auVar97._14_2_;
    auVar96[0xd] = 0xff;
    Var76 = CONCAT36(auVar96._13_3_,
                     CONCAT15((0 < sVar30) * (sVar30 < 0x100) * auVar107[0xc] - (0xff < sVar30),
                              uVar72));
    auVar95._12_4_ = (undefined4)((unkuint9)Var76 >> 0x28);
    auVar95[0xb] = 0xff;
    Var73 = CONCAT54(auVar95._11_5_,
                     CONCAT13((0 < sVar27) * (sVar27 < 0x100) * auVar107[10] - (0xff < sVar27),
                              uVar67));
    auVar94._10_6_ = (undefined6)((unkuint9)Var73 >> 0x18);
    auVar94[9] = 0xff;
    Var69 = CONCAT72(auVar94._9_7_,
                     CONCAT11((0 < sVar24) * (sVar24 < 0x100) * auVar107[8] - (0xff < sVar24),cVar10
                             ));
    auVar93._8_8_ = (undefined8)((unkuint9)Var69 >> 8);
    auVar93._0_8_ = 0xff00000000000000;
    Var66 = CONCAT91(auVar93._7_9_,(0 < sVar21) * (sVar21 < 0x100) * auVar107[6] - (0xff < sVar21));
    auVar92._6_10_ = Var66;
    auVar92._0_6_ = 0xff0000000000;
    auVar65._1_11_ = auVar92._5_11_;
    auVar65[0] = (0 < sVar18) * (sVar18 < 0x100) * auVar107[4] - (0xff < sVar18);
    auVar91._4_12_ = auVar65;
    auVar91._0_4_ = 0xff000000;
    auVar64._1_13_ = auVar91._3_13_;
    auVar64[0] = (0 < sVar15) * (sVar15 < 0x100) * auVar107[2] - (0xff < sVar15);
    auVar83[3] = 0xff;
    auVar83[2] = (0 < sVar12) * (sVar12 < 0x100) * auVar107[0] - (0xff < sVar12);
    auVar86._0_12_ = auVar82._0_12_;
    auVar86._12_2_ = (short)Var63;
    auVar86._14_2_ = (short)Var66;
    auVar85._12_4_ = auVar86._12_4_;
    auVar85._0_10_ = auVar82._0_10_;
    auVar85._10_2_ = auVar65._0_2_;
    auVar84._10_6_ = auVar85._10_6_;
    auVar84._0_8_ = auVar82._0_8_;
    auVar84._8_2_ = auVar62._0_2_;
    auVar83._8_8_ = auVar84._8_8_;
    auVar83._6_2_ = auVar64._0_2_;
    auVar83._4_2_ = auVar61._0_2_;
    auVar83._0_2_ = auVar82._0_2_;
    *(undefined1 (*) [16])dst_argb = auVar83;
    *(short *)*(undefined1 (*) [16])((long)dst_argb + 0x10) = (short)((unkuint9)Var68 >> 8);
    *(short *)(*(undefined1 (*) [16])((long)dst_argb + 0x10) + 2) = (short)((unkuint9)Var69 >> 8);
    *(short *)(*(undefined1 (*) [16])((long)dst_argb + 0x10) + 4) = (short)uVar59;
    *(short *)(*(undefined1 (*) [16])((long)dst_argb + 0x10) + 6) = (short)((unkuint9)Var73 >> 0x18)
    ;
    *(short *)(*(undefined1 (*) [16])((long)dst_argb + 0x10) + 8) = (short)uVar6;
    *(short *)(*(undefined1 (*) [16])((long)dst_argb + 0x10) + 10) =
         (short)((unkuint9)Var76 >> 0x28);
    *(undefined2 *)(*(undefined1 (*) [16])((long)dst_argb + 0x10) + 0xc) = uVar87;
    *(undefined2 *)(*(undefined1 (*) [16])((long)dst_argb + 0x10) + 0xe) = auVar96._14_2_;
    dst_argb = (uint8_t *)((long)dst_argb + 0x20);
    iVar79 = width + -8;
    bVar8 = 7 < width;
    width = iVar79;
  } while (iVar79 != 0 && bVar8);
  return;
}

Assistant:

void OMITFP I422ToARGBRow_SSSE3(const uint8_t* y_buf,
                                const uint8_t* u_buf,
                                const uint8_t* v_buf,
                                uint8_t* dst_argb,
                                const struct YuvConstants* yuvconstants,
                                int width) {
  asm volatile (
    YUVTORGB_SETUP(yuvconstants)
      "sub         %[u_buf],%[v_buf]             \n"
      "pcmpeqb     %%xmm5,%%xmm5                 \n"

    LABELALIGN
      "1:                                        \n"
    READYUV422
    YUVTORGB(yuvconstants)
    STOREARGB
      "sub         $0x8,%[width]                 \n"
      "jg          1b                            \n"
  : [y_buf]"+r"(y_buf),    // %[y_buf]
    [u_buf]"+r"(u_buf),    // %[u_buf]
    [v_buf]"+r"(v_buf),    // %[v_buf]
    [dst_argb]"+r"(dst_argb),  // %[dst_argb]
    [width]"+rm"(width)    // %[width]
  : [yuvconstants]"r"(yuvconstants)  // %[yuvconstants]
  : "memory", "cc", YUVTORGB_REGS
    "xmm0", "xmm1", "xmm2", "xmm3", "xmm4", "xmm5"
  );
}